

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

int duckdb::StringValueComparison(const_data_ptr_t data,idx_t len,const_data_ptr_t comparison)

{
  byte *pbVar1;
  byte *pbVar2;
  idx_t i;
  idx_t iVar3;
  
  iVar3 = 0;
  while( true ) {
    if (len == iVar3) {
      return 0;
    }
    pbVar1 = data + iVar3;
    pbVar2 = comparison + iVar3;
    if (*pbVar1 < *pbVar2) break;
    iVar3 = iVar3 + 1;
    if (*pbVar2 < *pbVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

static int StringValueComparison(const_data_ptr_t data, idx_t len, const_data_ptr_t comparison) {
	for (idx_t i = 0; i < len; i++) {
		if (data[i] < comparison[i]) {
			return -1;
		} else if (data[i] > comparison[i]) {
			return 1;
		}
	}
	return 0;
}